

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
google::protobuf::compiler::cpp::UnknownFieldsVars_abi_cxx11_
          (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cpp *this,Descriptor *desc,Options *opts)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar1;
  bool bVar2;
  FileDescriptor *file;
  CppType type;
  AlphaNum *b;
  AlphaNum *in_R8;
  Arg *this_00;
  Arg *in_R9;
  string_view format;
  string_view format_00;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4e8;
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_45c;
  key_equal local_45b;
  hasher local_45a;
  undefined1 local_459;
  Arg local_458;
  basic_string_view<char,_std::char_traits<char>_> local_428;
  string local_418;
  Arg local_3f8;
  Arg local_3c8;
  basic_string_view<char,_std::char_traits<char>_> local_398;
  string local_388;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_368;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  undefined1 local_2a0 [64];
  string_view local_260;
  AlphaNum local_250;
  AlphaNum local_220;
  string local_1f0;
  string local_1d0;
  AlphaNum local_1b0;
  AlphaNum local_180;
  string local_150;
  AlphaNum local_130;
  string_view local_100;
  AlphaNum local_f0;
  AlphaNum local_c0;
  string local_90;
  undefined1 local_60 [8];
  string default_instance;
  string unknown_fields_type;
  Options *opts_local;
  Descriptor *desc_local;
  
  type = (CppType)opts;
  std::__cxx11::string::string((string *)(default_instance.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  file = Descriptor::file((Descriptor *)this);
  bVar2 = UseUnknownFieldSet(file,(Options *)desc);
  if (bVar2) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,"::");
    local_100 = ProtobufNamespace((Options *)desc);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,local_100);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_130,"::UnknownFieldSet");
    b = &local_130;
    absl::lts_20250127::StrCat_abi_cxx11_(&local_90,(lts_20250127 *)&local_c0,&local_f0,b,in_R8);
    std::__cxx11::string::operator=
              ((string *)(default_instance.field_2._M_local_buf + 8),(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_180,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (default_instance.field_2._M_local_buf + 8));
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1b0,"::default_instance");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_150,(lts_20250127 *)&local_180,&local_1b0,b);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
  }
  else {
    PrimitiveTypeName_abi_cxx11_(&local_1d0,(cpp *)desc,(Options *)0x9,type);
    std::__cxx11::string::operator=
              ((string *)(default_instance.field_2._M_local_buf + 8),(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_220,"::");
    local_260 = ProtobufNamespace((Options *)desc);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_250,local_260);
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)(local_2a0 + 0x10),"::internal::GetEmptyString");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_1f0,(lts_20250127 *)&local_220,&local_250,(AlphaNum *)(local_2a0 + 0x10),in_R8
              );
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  local_459 = 1;
  local_368 = &local_360;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_398,"_internal_metadata_.unknown_fields<$0>($1)");
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_3c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&default_instance.field_2 + 8));
  this_00 = &local_3f8;
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  format._M_str = (char *)&local_3c8;
  format._M_len = (size_t)local_398._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_388,(lts_20250127 *)local_398._M_len,format,this_00,in_R9);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,(char (*) [15])0x1f682c2,&local_388);
  local_368 = &local_330;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (local_368,(char (*) [20])"unknown_fields_type",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&default_instance.field_2 + 8));
  local_368 = &local_300;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[42],_true>
            (local_368,(char (*) [20])"have_unknown_fields",
             (char (*) [42])"_internal_metadata_.have_unknown_fields()");
  local_368 = &local_2d0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_428,"_internal_metadata_.mutable_unknown_fields<$0>()");
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_458,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&default_instance.field_2 + 8));
  format_00._M_str = (char *)&local_458;
  format_00._M_len = (size_t)local_428._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_418,(lts_20250127 *)local_428._M_len,format_00,this_00);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[23],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_2d0,(char (*) [23])"mutable_unknown_fields",&local_418);
  local_459 = 0;
  local_2a0._0_8_ = &local_360;
  local_2a0._8_8_ = (char *)0x4;
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_45c);
  iVar1._M_len = local_2a0._8_8_;
  iVar1._M_array = (iterator)local_2a0._0_8_;
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::raw_hash_set(__return_storage_ptr__,iVar1,0,&local_45a,&local_45b,&local_45c);
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_45c);
  local_4e8 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_2a0;
  do {
    local_4e8 = local_4e8 + -1;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_4e8);
  } while (local_4e8 != &local_360);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(default_instance.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

absl::flat_hash_map<absl::string_view, std::string> UnknownFieldsVars(
    const Descriptor* desc, const Options& opts) {
  std::string unknown_fields_type;
  std::string default_instance;
  if (UseUnknownFieldSet(desc->file(), opts)) {
    unknown_fields_type =
        absl::StrCat("::", ProtobufNamespace(opts), "::UnknownFieldSet");
    default_instance = absl::StrCat(unknown_fields_type, "::default_instance");
  } else {
    unknown_fields_type =
        PrimitiveTypeName(opts, FieldDescriptor::CPPTYPE_STRING);
    default_instance = absl::StrCat("::", ProtobufNamespace(opts),
                                    "::internal::GetEmptyString");
  }

  return {
      {"unknown_fields",
       absl::Substitute("_internal_metadata_.unknown_fields<$0>($1)",
                        unknown_fields_type, default_instance)},
      {"unknown_fields_type", unknown_fields_type},
      {"have_unknown_fields", "_internal_metadata_.have_unknown_fields()"},
      {"mutable_unknown_fields",
       absl::Substitute("_internal_metadata_.mutable_unknown_fields<$0>()",
                        unknown_fields_type)},
  };
}